

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

void __thiscall
FStringTable::FindString(FStringTable *this,char *name,StringEntry ***pentry1,StringEntry **entry1)

{
  uint uVar1;
  int iVar2;
  StringEntry *pSStack_40;
  int cmpval;
  StringEntry *entry;
  StringEntry **pentry;
  DWORD bucket;
  StringEntry **entry1_local;
  StringEntry ***pentry1_local;
  char *name_local;
  FStringTable *this_local;
  
  uVar1 = MakeKey(name);
  entry = (StringEntry *)(this->Buckets + (uVar1 & 0x7f));
  pSStack_40 = entry->Next;
  while( true ) {
    if (pSStack_40 == (StringEntry *)0x0) {
      *pentry1 = &entry->Next;
      *entry1 = (StringEntry *)0x0;
      return;
    }
    iVar2 = strcasecmp(pSStack_40->Name,name);
    if (iVar2 == 0) break;
    if (iVar2 == 1) {
      *pentry1 = &entry->Next;
      *entry1 = (StringEntry *)0x0;
      return;
    }
    entry = pSStack_40;
    pSStack_40 = pSStack_40->Next;
  }
  *pentry1 = &entry->Next;
  *entry1 = pSStack_40;
  return;
}

Assistant:

void FStringTable::FindString (const char *name, StringEntry **&pentry1, StringEntry *&entry1)
{
	DWORD bucket = MakeKey (name) & (HASH_SIZE - 1);
	StringEntry **pentry = &Buckets[bucket], *entry = *pentry;

	while (entry != NULL)
	{
		int cmpval = stricmp (entry->Name, name);
		if (cmpval == 0)
		{
			pentry1 = pentry;
			entry1 = entry;
			return;
		}
		if (cmpval == 1)
		{
			pentry1 = pentry;
			entry1 = NULL;
			return;
		}
		pentry = &entry->Next;
		entry = *pentry;
	}
	pentry1 = pentry;
	entry1 = entry;
}